

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O1

void sendChangeRecursively(QWidget *widget,Type type)

{
  long lVar1;
  QWidget *widget_00;
  ulong uVar2;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_38,type);
  QCoreApplication::sendEvent(&widget->super_QObject,(QEvent *)&local_38);
  lVar1 = *(long *)&widget->field_0x8;
  if (*(long *)(lVar1 + 0x28) != 0) {
    uVar2 = 0;
    do {
      widget_00 = *(QWidget **)(*(long *)(lVar1 + 0x20) + uVar2 * 8);
      if ((widget_00 == (QWidget *)0x0) ||
         ((*(byte *)(*(long *)&widget_00->field_0x8 + 0x30) & 1) == 0)) {
        widget_00 = (QWidget *)0x0;
      }
      if (widget_00 != (QWidget *)0x0) {
        sendChangeRecursively(widget_00,type);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < *(ulong *)(lVar1 + 0x28));
  }
  QEvent::~QEvent((QEvent *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void sendChangeRecursively(QWidget *widget, QEvent::Type type)
{
    QEvent e(type);
    QCoreApplication::sendEvent(widget, &e);
    QWidgetPrivate *d = QWidgetPrivate::get(widget);
    for (int i = 0; i < d->children.size(); ++i) {
        QWidget *w = qobject_cast<QWidget *>(d->children.at(i));
        if (w)
            sendChangeRecursively(w, type);
    }
}